

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall MarrayTest::assignmentOperatorTest<true>(MarrayTest *this)

{
  int iVar1;
  pointer piVar2;
  undefined8 uVar3;
  MarrayTest *pMVar4;
  bool bVar5;
  reference piVar6;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var7;
  size_t sVar8;
  size_t sVar9;
  reference piVar10;
  reference piVar11;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var12;
  logic_error *plVar13;
  runtime_error *prVar14;
  code *pcVar15;
  size_t sVar16;
  int iVar17;
  undefined *puVar18;
  bool bVar19;
  Marray<int,_std::allocator<unsigned_long>_> m;
  Marray<int,_std::allocator<unsigned_long>_> n;
  int scalar;
  int local_f4;
  unsigned_long *local_f0;
  Marray<int,_std::allocator<unsigned_long>_> local_e8;
  undefined1 local_a0 [16];
  size_t *local_90;
  size_t *psStack_88;
  size_t *local_80;
  size_t sStack_78;
  size_t local_70;
  CoordinateOrder local_68;
  bool local_64;
  int local_54;
  int *local_50;
  MarrayTest *local_48;
  unsigned_long *local_40;
  unsigned_long *local_38;
  
  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ = (pointer)0x0;
  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.shape_ = (size_t *)0x0;
  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.shapeStrides_ =
       (size_t *)0x0;
  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.strides_ = (size_t *)0x0
  ;
  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.dimension_ = 0;
  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ = 0;
  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.coordinateOrder_ =
       LastMajorOrder;
  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.isSimple_ = true;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            (&local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            (&local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>);
  if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.isSimple_ == false)
  {
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar14,"Assertion failed.");
    __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_a0._0_8_ = (pointer)0x0;
  local_90 = (size_t *)0x0;
  psStack_88 = (size_t *)0x0;
  local_80 = (size_t *)0x0;
  sStack_78 = 0;
  local_70 = 0;
  local_68 = LastMajorOrder;
  local_64 = true;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
  if (local_64 == false) {
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar14,"Assertion failed.");
    __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_a0,&local_e8);
  operator_delete((void *)local_a0._0_8_,local_70 << 2);
  operator_delete(local_90,sStack_78 * 0x18);
  operator_delete(local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ <<
                  2);
  operator_delete(local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.shape_,
                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                  dimension_ * 0x18);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            (&local_e8,&this->scalar_,&andres::defaultOrder,(allocator_type *)local_a0);
  local_a0._0_8_ = (pointer)0x0;
  local_90 = (size_t *)0x0;
  psStack_88 = (size_t *)0x0;
  local_80 = (size_t *)0x0;
  sStack_78 = 0;
  local_70 = 0;
  local_68 = LastMajorOrder;
  local_64 = true;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
  if (local_64 == false) {
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar14,"Assertion failed.");
    __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_a0,&local_e8);
  if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ == (pointer)0x0) {
    plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar13,"Assertion failed.");
  }
  else {
    if ((pointer)local_a0._0_8_ != (pointer)0x0) {
      if ((local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.dimension_ ==
           sStack_78) &&
         (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
          local_70)) {
        local_f4 = 0;
        piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                 execute<int,int,false,std::allocator<unsigned_long>>
                           (&local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>,
                            &local_f4);
        iVar17 = *piVar6;
        local_f4 = 0;
        piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                 execute<int,int,false,std::allocator<unsigned_long>>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0,&local_f4);
        if (iVar17 == *piVar6) {
          operator_delete((void *)local_a0._0_8_,local_70 << 2);
          operator_delete(local_90,sStack_78 * 0x18);
          operator_delete(local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                          local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          size_ << 2);
          operator_delete(local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          shape_,local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                 geometry_.dimension_ * 0x18);
          _Var7._M_current = (unsigned_long *)operator_new(8);
          *_Var7._M_current = 0x18;
          andres::Marray<int,std::allocator<unsigned_long>>::
          Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Marray<int,std::allocator<unsigned_long>> *)&local_e8,_Var7,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(_Var7._M_current + 1),&this->scalar_,&andres::defaultOrder,
                     (allocator_type *)local_a0);
          local_a0._0_8_ = (pointer)0x0;
          local_90 = (size_t *)0x0;
          psStack_88 = (size_t *)0x0;
          local_80 = (size_t *)0x0;
          sStack_78 = 0;
          local_70 = 0;
          local_68 = LastMajorOrder;
          local_64 = true;
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
          if (local_64 == false) {
            prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar14,"Assertion failed.");
            __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
                    ((Marray<int,_std::allocator<unsigned_long>_> *)local_a0,&local_e8);
          local_48 = this;
          if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ !=
              local_70) {
LAB_001e3cfa:
            plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar13,"test failed.");
            pcVar15 = std::logic_error::~logic_error;
            puVar18 = &std::logic_error::typeinfo;
            goto LAB_001e40bd;
          }
          if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ == (pointer)0x0)
          {
            plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar13,"Assertion failed.");
          }
          else {
            if ((pointer)local_a0._0_8_ != (pointer)0x0) {
              if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                  dimension_ != sStack_78) goto LAB_001e3cfa;
              iVar17 = 0;
              do {
                local_f4 = iVar17;
                piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                         execute<int,int,false,std::allocator<unsigned_long>>
                                   (&local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>
                                    ,&local_f4);
                iVar1 = *piVar6;
                local_f4 = iVar17;
                piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                         execute<int,int,false,std::allocator<unsigned_long>>
                                   ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0,
                                    &local_f4);
                if (iVar1 != *piVar6) {
                  plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar13,"test failed.");
                  __cxa_throw(plVar13,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                }
                iVar17 = iVar17 + 1;
              } while (iVar17 != 0x18);
              operator_delete((void *)local_a0._0_8_,local_70 << 2);
              operator_delete(local_90,sStack_78 * 0x18);
              operator_delete(local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                              local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.size_ << 2);
              operator_delete(local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.shape_,
                              local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.dimension_ * 0x18);
              operator_delete(_Var7._M_current,8);
              _Var7._M_current = (unsigned_long *)operator_new(0x10);
              *_Var7._M_current = 6;
              _Var7._M_current[1] = 4;
              andres::Marray<int,std::allocator<unsigned_long>>::
              Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Marray<int,std::allocator<unsigned_long>> *)&local_e8,_Var7,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var7._M_current + 2),&local_48->scalar_,&andres::defaultOrder,
                         (allocator_type *)local_a0);
              local_a0._0_8_ = (pointer)0x0;
              local_90 = (size_t *)0x0;
              psStack_88 = (size_t *)0x0;
              local_80 = (size_t *)0x0;
              sStack_78 = 0;
              local_70 = 0;
              local_68 = LastMajorOrder;
              local_64 = true;
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
              if (local_64 == false) {
                prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar14,"Assertion failed.");
                __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
                        ((Marray<int,_std::allocator<unsigned_long>_> *)local_a0,&local_e8);
              if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ !=
                  local_70) {
LAB_001e3d29:
                plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar13,"test failed.");
                pcVar15 = std::logic_error::~logic_error;
                puVar18 = &std::logic_error::typeinfo;
                goto LAB_001e413f;
              }
              if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ ==
                  (pointer)0x0) {
                plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar13,"Assertion failed.");
              }
              else {
                if ((pointer)local_a0._0_8_ != (pointer)0x0) {
                  if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      dimension_ != sStack_78) goto LAB_001e3d29;
                  sVar16 = 0;
                  do {
                    iVar17 = 0;
                    do {
                      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                                         ((View<int,false,std::allocator<unsigned_long>> *)&local_e8
                                          ,sVar16,iVar17);
                      iVar1 = *piVar6;
                      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                                         ((View<int,false,std::allocator<unsigned_long>> *)local_a0,
                                          sVar16,iVar17);
                      if (iVar1 != *piVar6) {
                        plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar13,"test failed.");
                        __cxa_throw(plVar13,&std::logic_error::typeinfo,
                                    std::logic_error::~logic_error);
                      }
                      iVar17 = iVar17 + 1;
                    } while (iVar17 != 4);
                    sVar16 = sVar16 + 1;
                  } while (sVar16 != 6);
                  operator_delete((void *)local_a0._0_8_,local_70 << 2);
                  operator_delete(local_90,sStack_78 * 0x18);
                  operator_delete(local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  data_,local_e8.
                                        super_View<int,_false,_std::allocator<unsigned_long>_>.
                                        geometry_.size_ << 2);
                  operator_delete(local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.shape_,
                                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.dimension_ * 0x18);
                  operator_delete(_Var7._M_current,0x10);
                  local_50 = (int *)operator_new(0x18);
                  *(unsigned_long *)local_50 = 3;
                  *(unsigned_long *)((long)local_50 + 8) = 4;
                  *(unsigned_long *)((long)local_50 + 0x10) = 2;
                  andres::Marray<int,std::allocator<unsigned_long>>::
                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            ((Marray<int,std::allocator<unsigned_long>> *)&local_e8,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )local_50,(unsigned_long *)((long)local_50 + 0x18),&local_48->scalar_,
                             &andres::defaultOrder,(allocator_type *)local_a0);
                  local_a0._0_8_ = (pointer)0x0;
                  local_90 = (size_t *)0x0;
                  psStack_88 = (size_t *)0x0;
                  local_80 = (size_t *)0x0;
                  sStack_78 = 0;
                  local_70 = 0;
                  local_68 = LastMajorOrder;
                  local_64 = true;
                  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
                  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0);
                  if (local_64 == false) {
                    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar14,"Assertion failed.");
                    __cxa_throw(prVar14,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
                            ((Marray<int,_std::allocator<unsigned_long>_> *)local_a0,&local_e8);
                  if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      size_ != local_70) {
LAB_001e3d58:
                    plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::logic_error::logic_error(plVar13,"test failed.");
                    pcVar15 = std::logic_error::~logic_error;
                    puVar18 = &std::logic_error::typeinfo;
                    goto LAB_001e41c1;
                  }
                  if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ ==
                      (pointer)0x0) {
                    plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error((runtime_error *)plVar13,"Assertion failed.");
                  }
                  else {
                    if ((pointer)local_a0._0_8_ != (pointer)0x0) {
                      if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          dimension_ != sStack_78) goto LAB_001e3d58;
                      local_f0 = (unsigned_long *)0x0;
                      do {
                        sVar16 = 0;
                        do {
                          iVar17 = 0;
                          bVar5 = true;
                          do {
                            bVar19 = bVar5;
                            andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                      (&local_e8.
                                        super_View<int,_false,_std::allocator<unsigned_long>_>);
                            piVar2 = local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>
                                     .data_;
                            if ((local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                 data_ == (pointer)0x0) ||
                               (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                geometry_.dimension_ != 3)) {
                              plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        ((runtime_error *)plVar13,"Assertion failed.");
LAB_001e3978:
                              pcVar15 = std::runtime_error::~runtime_error;
                              puVar18 = &std::runtime_error::typeinfo;
LAB_001e3986:
                              __cxa_throw(plVar13,puVar18,pcVar15);
                            }
                            sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                    strides(&local_e8.
                                             super_View<int,_false,_std::allocator<unsigned_long>_>,
                                            0);
                            sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                    elementAccessHelper<int>
                                              (&local_e8.
                                                super_View<int,_false,_std::allocator<unsigned_long>_>
                                               ,3,sVar16,iVar17);
                            iVar1 = piVar2[sVar8 * (long)local_f0 + sVar9];
                            andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a0)
                            ;
                            uVar3 = local_a0._0_8_;
                            if (((pointer)local_a0._0_8_ == (pointer)0x0) || (sStack_78 != 3)) {
                              plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        ((runtime_error *)plVar13,"Assertion failed.");
                              goto LAB_001e3978;
                            }
                            sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                    strides((View<int,_false,_std::allocator<unsigned_long>_> *)
                                            local_a0,0);
                            sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                    elementAccessHelper<int>
                                              ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                               local_a0,3,sVar16,iVar17);
                            if (iVar1 != *(int *)(uVar3 + (sVar8 * (long)local_f0 + sVar9) * 4)) {
                              plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar13,"test failed.");
                              pcVar15 = std::logic_error::~logic_error;
                              puVar18 = &std::logic_error::typeinfo;
                              goto LAB_001e3986;
                            }
                            iVar17 = 1;
                            bVar5 = false;
                          } while (bVar19);
                          sVar16 = sVar16 + 1;
                        } while (sVar16 != 4);
                        local_f0 = (unsigned_long *)((long)local_f0 + 1);
                      } while (local_f0 != (unsigned_long *)0x3);
                      operator_delete((void *)local_a0._0_8_,local_70 << 2);
                      operator_delete(local_90,sStack_78 * 0x18);
                      operator_delete(local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.size_ << 2);
                      operator_delete(local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.shape_,
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.dimension_ * 0x18);
                      operator_delete(local_50,0x18);
                      local_a0._0_8_ = (pointer)0x0;
                      local_90 = (size_t *)0x0;
                      psStack_88 = (size_t *)0x0;
                      local_80 = (size_t *)0x0;
                      sStack_78 = 0;
                      local_70 = 0;
                      local_68 = LastMajorOrder;
                      local_64 = true;
                      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a0);
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ =
                           (pointer)0x0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      shape_ = (size_t *)0x0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      shapeStrides_ = (size_t *)0x0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      strides_ = (size_t *)0x0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      dimension_ = 0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      size_ = 0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      coordinateOrder_ = LastMajorOrder;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      isSimple_ = true;
                      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                (&local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>);
                      pMVar4 = local_48;
                      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                (&local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>);
                      if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          isSimple_ == false) {
                        prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(prVar14,"Assertion failed.");
                        __cxa_throw(prVar14,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      andres::Marray<int,std::allocator<unsigned_long>>::operator=
                                ((Marray<int,std::allocator<unsigned_long>> *)&local_e8,
                                 (View<int,_true,_std::allocator<unsigned_long>_> *)local_a0);
                      operator_delete(local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.size_ << 2);
                      operator_delete(local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.shape_,
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.dimension_ * 0x18);
                      operator_delete(local_90,sStack_78 * 0x18);
                      local_a0._0_8_ = pMVar4;
                      local_90 = (size_t *)operator_new(0);
                      sStack_78 = 0;
                      local_70 = 1;
                      local_68 = LastMajorOrder;
                      local_64 = true;
                      psStack_88 = local_90;
                      local_80 = local_90;
                      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a0);
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ =
                           (pointer)0x0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      shape_ = (size_t *)0x0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      shapeStrides_ = (size_t *)0x0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      strides_ = (size_t *)0x0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      dimension_ = 0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      size_ = 0;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      coordinateOrder_ = LastMajorOrder;
                      local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      isSimple_ = true;
                      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                (&local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>);
                      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                (&local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>);
                      if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          isSimple_ == false) {
                        prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(prVar14,"Assertion failed.");
                        __cxa_throw(prVar14,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      andres::Marray<int,std::allocator<unsigned_long>>::operator=
                                ((Marray<int,std::allocator<unsigned_long>> *)&local_e8,
                                 (View<int,_true,_std::allocator<unsigned_long>_> *)local_a0);
                      if (local_70 !=
                          local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          size_) goto LAB_001e3ccb;
                      if ((MarrayTest *)local_a0._0_8_ == (MarrayTest *)0x0) {
                        plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  ((runtime_error *)plVar13,"Assertion failed.");
                      }
                      else {
                        if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ !=
                            (pointer)0x0) {
                          if (sStack_78 ==
                              local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.dimension_) {
                            local_f4 = 0;
                            piVar10 = andres::marray_detail::AccessOperatorHelper<true>::
                                      execute<int,int,true,std::allocator<unsigned_long>>
                                                ((View<int,_true,_std::allocator<unsigned_long>_> *)
                                                 local_a0,&local_f4);
                            iVar17 = *piVar10;
                            local_f4 = 0;
                            piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                                     execute<int,int,false,std::allocator<unsigned_long>>
                                               (&local_e8.
                                                 super_View<int,_false,_std::allocator<unsigned_long>_>
                                                ,&local_f4);
                            if (iVar17 == *piVar6) {
                              operator_delete(local_e8.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                              operator_delete(local_e8.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.shape_,
                                              local_e8.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.dimension_ * 0x18);
                              operator_delete(local_90,sStack_78 * 0x18);
                              _Var7._M_current = (unsigned_long *)operator_new(8);
                              *_Var7._M_current = 0x18;
                              local_a0._0_8_ = pMVar4->data_;
                              local_50 = (int *)local_a0._0_8_;
                              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                        ((Geometry<std::allocator<unsigned_long>> *)(local_a0 + 8),
                                         _Var7,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                )(_Var7._M_current + 1),&andres::defaultOrder,
                                         &andres::defaultOrder,(allocator_type *)&local_e8);
                              andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a0
                                        );
                              local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.data_
                                   = (pointer)0x0;
                              local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.shape_ = (size_t *)0x0;
                              local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.shapeStrides_ = (size_t *)0x0;
                              local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.strides_ = (size_t *)0x0;
                              local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.dimension_ = 0;
                              local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.size_ = 0;
                              local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.coordinateOrder_ = LastMajorOrder;
                              local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.isSimple_ = true;
                              andres::View<int,_false,_std::allocator<unsigned_long>_>::
                              testInvariant(&local_e8.
                                             super_View<int,_false,_std::allocator<unsigned_long>_>)
                              ;
                              andres::View<int,_false,_std::allocator<unsigned_long>_>::
                              testInvariant(&local_e8.
                                             super_View<int,_false,_std::allocator<unsigned_long>_>)
                              ;
                              if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.isSimple_ == false) {
                                prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error(prVar14,"Assertion failed.");
                                __cxa_throw(prVar14,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              andres::Marray<int,std::allocator<unsigned_long>>::operator=
                                        ((Marray<int,std::allocator<unsigned_long>> *)&local_e8,
                                         (View<int,_true,_std::allocator<unsigned_long>_> *)local_a0
                                        );
                              if (local_70 !=
                                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.size_) {
LAB_001e3de5:
                                plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::logic_error::logic_error(plVar13,"test failed.");
                                pcVar15 = std::logic_error::~logic_error;
                                puVar18 = &std::logic_error::typeinfo;
                                goto LAB_001e4326;
                              }
                              if ((int *)local_a0._0_8_ == (int *)0x0) {
                                plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar13,"Assertion failed.");
                              }
                              else {
                                if (local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                    data_ != (pointer)0x0) {
                                  if (sStack_78 !=
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.dimension_) goto LAB_001e3de5;
                                  iVar17 = 0;
                                  do {
                                    local_f4 = iVar17;
                                    piVar10 = andres::marray_detail::AccessOperatorHelper<true>::
                                              execute<int,int,true,std::allocator<unsigned_long>>
                                                        ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_a0,&local_f4);
                                    iVar1 = *piVar10;
                                    local_f4 = iVar17;
                                    piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                                             execute<int,int,false,std::allocator<unsigned_long>>
                                                       (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                    if (iVar1 != *piVar6) {
                                      plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar13,"test failed.");
                                      __cxa_throw(plVar13,&std::logic_error::typeinfo,
                                                  std::logic_error::~logic_error);
                                    }
                                    iVar17 = iVar17 + 1;
                                  } while (iVar17 != 0x18);
                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                  operator_delete(local_90,sStack_78 * 0x18);
                                  operator_delete(_Var7._M_current,8);
                                  _Var7._M_current = (unsigned_long *)operator_new(0x10);
                                  *_Var7._M_current = 6;
                                  _Var7._M_current[1] = 4;
                                  local_a0._0_8_ = local_50;
                                  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                            ((Geometry<std::allocator<unsigned_long>> *)
                                             (local_a0 + 8),_Var7,
                                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                              )(_Var7._M_current + 2),&andres::defaultOrder,
                                             &andres::defaultOrder,(allocator_type *)&local_e8);
                                  andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_true,_std::allocator<unsigned_long>_> *)
                                                local_a0);
                                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  data_ = (pointer)0x0;
                                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.shape_ = (size_t *)0x0;
                                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.shapeStrides_ = (size_t *)0x0;
                                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.strides_ = (size_t *)0x0;
                                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.dimension_ = 0;
                                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.size_ = 0;
                                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.coordinateOrder_ = LastMajorOrder;
                                  local_e8.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.isSimple_ = true;
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant(&local_e8.
                                                 super_View<int,_false,_std::allocator<unsigned_long>_>
                                               );
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant(&local_e8.
                                                 super_View<int,_false,_std::allocator<unsigned_long>_>
                                               );
                                  if (local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.isSimple_ == false) {
                                    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error(prVar14,"Assertion failed.");
                                    __cxa_throw(prVar14,&std::runtime_error::typeinfo,
                                                std::runtime_error::~runtime_error);
                                  }
                                  andres::Marray<int,std::allocator<unsigned_long>>::operator=
                                            ((Marray<int,std::allocator<unsigned_long>> *)&local_e8,
                                             (View<int,_true,_std::allocator<unsigned_long>_> *)
                                             local_a0);
                                  if (local_70 !=
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.size_) {
LAB_001e3e14:
                                    plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar13,"test failed.");
                                    pcVar15 = std::logic_error::~logic_error;
                                    puVar18 = &std::logic_error::typeinfo;
                                    goto LAB_001e43a8;
                                  }
                                  if ((int *)local_a0._0_8_ == (int *)0x0) {
                                    plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar13,"Assertion failed.");
                                  }
                                  else {
                                    if (local_e8.
                                        super_View<int,_false,_std::allocator<unsigned_long>_>.data_
                                        != (pointer)0x0) {
                                      if (sStack_78 !=
                                          local_e8.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.dimension_) goto LAB_001e3e14;
                                      sVar16 = 0;
                                      do {
                                        iVar17 = 0;
                                        do {
                                          piVar10 = andres::
                                                  View<int,true,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,true,std::allocator<unsigned_long>> *)
                                                  local_a0,sVar16,iVar17);
                                          iVar1 = *piVar10;
                                          piVar6 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_e8,sVar16,iVar17);
                                          if (iVar1 != *piVar6) {
                                            plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::logic_error::logic_error(plVar13,"test failed.");
                                            __cxa_throw(plVar13,&std::logic_error::typeinfo,
                                                        std::logic_error::~logic_error);
                                          }
                                          iVar17 = iVar17 + 1;
                                        } while (iVar17 != 4);
                                        sVar16 = sVar16 + 1;
                                      } while (sVar16 != 6);
                                      operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                      operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                      operator_delete(local_90,sStack_78 * 0x18);
                                      operator_delete(_Var7._M_current,0x10);
                                      local_40 = (unsigned_long *)operator_new(0x18);
                                      *local_40 = 3;
                                      local_40[1] = 4;
                                      local_40[2] = 2;
                                      local_a0._0_8_ = local_50;
                                      andres::marray_detail::Geometry<std::allocator<unsigned_long>>
                                      ::
                                      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                ((Geometry<std::allocator<unsigned_long>> *)
                                                 (local_a0 + 8),
                                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_40,
                                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_40 + 3),&andres::defaultOrder,
                                                 &andres::defaultOrder,(allocator_type *)&local_e8);
                                      andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                      testInvariant((View<int,_true,_std::allocator<unsigned_long>_>
                                                     *)local_a0);
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.data_ =
                                           (pointer)0x0;
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.shape_ = (size_t *)0x0;
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.shapeStrides_ = (size_t *)0x0;
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.strides_ = (size_t *)0x0;
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.dimension_ = 0;
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.size_ = 0;
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.coordinateOrder_ = LastMajorOrder;
                                      local_e8.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.isSimple_ = true;
                                      andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                      andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                      if (local_e8.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.isSimple_ == false) {
                                        prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  (prVar14,"Assertion failed.");
                                        __cxa_throw(prVar14,&std::runtime_error::typeinfo,
                                                    std::runtime_error::~runtime_error);
                                      }
                                      andres::Marray<int,std::allocator<unsigned_long>>::operator=
                                                ((Marray<int,std::allocator<unsigned_long>> *)
                                                 &local_e8,
                                                 (View<int,_true,_std::allocator<unsigned_long>_> *)
                                                 local_a0);
                                      if (local_70 !=
                                          local_e8.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.size_) {
LAB_001e3e43:
                                        plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::logic_error::logic_error(plVar13,"test failed.");
                                        pcVar15 = std::logic_error::~logic_error;
                                        puVar18 = &std::logic_error::typeinfo;
                                        goto LAB_001e442a;
                                      }
                                      if ((int *)local_a0._0_8_ == (int *)0x0) {
                                        plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar13,"Assertion failed.");
                                      }
                                      else {
                                        if (local_e8.
                                            super_View<int,_false,_std::allocator<unsigned_long>_>.
                                            data_ != (pointer)0x0) {
                                          if (sStack_78 !=
                                              local_e8.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.dimension_) goto LAB_001e3e43;
                                          local_f0 = (unsigned_long *)0x0;
                                          do {
                                            sVar16 = 0;
                                            do {
                                              iVar17 = 0;
                                              bVar5 = true;
                                              do {
                                                bVar19 = bVar5;
                                                andres::
                                                View<int,_true,_std::allocator<unsigned_long>_>::
                                                testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_a0);
                                                uVar3 = local_a0._0_8_;
                                                if (((int *)local_a0._0_8_ == (int *)0x0) ||
                                                   (sStack_78 != 3)) {
                                                  plVar13 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar13,
                                                             "Assertion failed.");
LAB_001e39f4:
                                                  pcVar15 = std::runtime_error::~runtime_error;
                                                  puVar18 = &std::runtime_error::typeinfo;
LAB_001e3a02:
                                                  __cxa_throw(plVar13,puVar18,pcVar15);
                                                }
                                                sVar8 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_a0,0);
                                                sVar9 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_a0,3,sVar16,iVar17);
                                                iVar1 = *(int *)(uVar3 + (sVar8 * (long)local_f0 +
                                                                         sVar9) * 4);
                                                andres::
                                                View<int,_false,_std::allocator<unsigned_long>_>::
                                                testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                piVar2 = local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_;
                                                if ((local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) ||
                                                  (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                  plVar13 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar13,
                                                             "Assertion failed.");
                                                  goto LAB_001e39f4;
                                                }
                                                sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,sVar16,iVar17);
                                                if (iVar1 != piVar2[sVar8 * (long)local_f0 + sVar9])
                                                {
                                                  plVar13 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar13,"test failed.");
                                                  pcVar15 = std::logic_error::~logic_error;
                                                  puVar18 = &std::logic_error::typeinfo;
                                                  goto LAB_001e3a02;
                                                }
                                                iVar17 = 1;
                                                bVar5 = false;
                                              } while (bVar19);
                                              sVar16 = sVar16 + 1;
                                            } while (sVar16 != 4);
                                            local_f0 = (unsigned_long *)((long)local_f0 + 1);
                                          } while (local_f0 != (unsigned_long *)0x3);
                                          operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                          operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                          operator_delete(local_90,sStack_78 * 0x18);
                                          operator_delete(local_40,0x18);
                                          local_e8.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          data_ = (pointer)0x0;
                                          local_e8.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.shape_ = (size_t *)0x0;
                                          local_e8.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.shapeStrides_ = (size_t *)0x0;
                                          local_e8.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.strides_ = (size_t *)0x0;
                                          local_e8.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.dimension_ = 0;
                                          local_e8.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.size_ = 0;
                                          local_e8.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.coordinateOrder_ = LastMajorOrder;
                                          local_e8.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.isSimple_ = true;
                                          andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                          testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                          andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                          testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                          pMVar4 = local_48;
                                          if (local_e8.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.isSimple_ == false) {
                                            prVar14 = (runtime_error *)
                                                      __cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      (prVar14,"Assertion failed.");
                                            __cxa_throw(prVar14,&std::runtime_error::typeinfo,
                                                        std::runtime_error::~runtime_error);
                                          }
                                          andres::Marray<int,_std::allocator<unsigned_long>_>::
                                          Marray((Marray<int,_std::allocator<unsigned_long>_> *)
                                                 local_a0,&local_48->scalar_,&andres::defaultOrder,
                                                 (allocator_type *)&local_f4);
                                          andres::Marray<int,_std::allocator<unsigned_long>_>::
                                          operator=((Marray<int,_std::allocator<unsigned_long>_> *)
                                                    local_a0,&local_e8);
                                          operator_delete((void *)local_a0._0_8_,local_70 << 2);
                                          operator_delete(local_90,sStack_78 * 0x18);
                                          operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                          operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                          local_54 = 2;
                                          andres::Marray<int,_std::allocator<unsigned_long>_>::
                                          Marray(&local_e8,&local_54,&andres::defaultOrder,
                                                 (allocator_type *)local_a0);
                                          andres::Marray<int,_std::allocator<unsigned_long>_>::
                                          Marray((Marray<int,_std::allocator<unsigned_long>_> *)
                                                 local_a0,&pMVar4->scalar_,&andres::defaultOrder,
                                                 (allocator_type *)&local_f4);
                                          local_f4 = 0;
                                          piVar6 = andres::marray_detail::AccessOperatorHelper<true>
                                                   ::
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                          andres::Marray<int,_std::allocator<unsigned_long>_>::
                                          operator=((Marray<int,_std::allocator<unsigned_long>_> *)
                                                    local_a0,&local_e8);
                                          local_f4 = 0;
                                          piVar11 = andres::marray_detail::
                                                    AccessOperatorHelper<true>::
                                                                                                        
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                          if (piVar11 != piVar6) {
                                            plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::logic_error::logic_error(plVar13,"test failed.");
                                            __cxa_throw(plVar13,&std::logic_error::typeinfo,
                                                        std::logic_error::~logic_error);
                                          }
                                          if (local_e8.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .data_ == (pointer)0x0) {
                                            plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      ((runtime_error *)plVar13,"Assertion failed.")
                                            ;
                                          }
                                          else {
                                            if ((int *)local_a0._0_8_ != (int *)0x0) {
                                              if ((local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ == sStack_78) &&
                                                 (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ == local_70)) {
                                                local_f4 = 0;
                                                piVar6 = andres::marray_detail::
                                                         AccessOperatorHelper<true>::
                                                                                                                  
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                iVar17 = *piVar6;
                                                local_f4 = 0;
                                                piVar6 = andres::marray_detail::
                                                         AccessOperatorHelper<true>::
                                                                                                                  
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                                if (iVar17 == *piVar6) {
                                                  operator_delete((void *)local_a0._0_8_,
                                                                  local_70 << 2);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  local_a0._0_8_ = (pointer)0x0;
                                                  local_90 = (size_t *)0x0;
                                                  psStack_88 = (size_t *)0x0;
                                                  local_80 = (size_t *)0x0;
                                                  sStack_78 = 0;
                                                  local_70 = 0;
                                                  local_68 = LastMajorOrder;
                                                  local_64 = true;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_a0);
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  Marray(&local_e8,&pMVar4->scalar_,
                                                         &andres::defaultOrder,
                                                         (allocator_type *)&local_f4);
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_a0);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  local_a0._0_8_ = pMVar4;
                                                  local_90 = (size_t *)operator_new(0);
                                                  sStack_78 = 0;
                                                  local_70 = 1;
                                                  local_68 = LastMajorOrder;
                                                  local_64 = true;
                                                  psStack_88 = local_90;
                                                  local_80 = local_90;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_a0);
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  Marray(&local_e8,&pMVar4->scalar_,
                                                         &andres::defaultOrder,
                                                         (allocator_type *)&local_f4);
                                                  local_f4 = 0;
                                                  piVar6 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_a0);
                                                  local_f4 = 0;
                                                  piVar11 = andres::marray_detail::
                                                            AccessOperatorHelper<true>::
                                                                                                                        
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                  if (piVar11 != piVar6) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar13,"test failed.");
                                                    __cxa_throw(plVar13,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_70 !=
                                                      local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_) goto LAB_001e3db6;
                                                  if ((MarrayTest *)local_a0._0_8_ ==
                                                      (MarrayTest *)0x0) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar13,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ != (pointer)0x0) {
                                                    if (sStack_78 ==
                                                        local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) {
                                                    local_f4 = 0;
                                                    piVar10 = andres::marray_detail::
                                                              AccessOperatorHelper<true>::
                                                                                                                            
                                                  execute<int,int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_a0,&local_f4);
                                                  iVar17 = *piVar10;
                                                  local_f4 = 0;
                                                  piVar6 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                  if (iVar17 == *piVar6) {
                                                    operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ = (pointer)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_ = (size_t *)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shapeStrides_ = (size_t *)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.strides_ = (size_t *)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ = 0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ = 0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.coordinateOrder_ = LastMajorOrder;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.isSimple_ = true;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.isSimple_ == false) {
                                                    prVar14 = (runtime_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              (prVar14,"Assertion failed.");
                                                    __cxa_throw(prVar14,&std::runtime_error::
                                                                         typeinfo,
                                                                std::runtime_error::~runtime_error);
                                                  }
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var7._M_current = 0x18;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  local_a0,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 1),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  operator=((
                                                  Marray<int,_std::allocator<unsigned_long>_> *)
                                                  local_a0,&local_e8);
                                                  operator_delete((void *)local_a0._0_8_,
                                                                  local_70 << 2);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  operator_delete(_Var7._M_current,8);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  local_54 = 2;
                                                  local_f0 = (unsigned_long *)operator_new(8);
                                                  *local_f0 = 0x18;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_f0,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_f0 + 1),&local_54,&andres::defaultOrder,
                                                  (allocator_type *)local_a0);
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var7._M_current = 0x18;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  local_a0,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 1),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  local_f4 = 0;
                                                  piVar6 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  operator=((
                                                  Marray<int,_std::allocator<unsigned_long>_> *)
                                                  local_a0,&local_e8);
                                                  local_f4 = 0;
                                                  piVar11 = andres::marray_detail::
                                                            AccessOperatorHelper<true>::
                                                                                                                        
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                                  if (piVar11 != piVar6) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar13,"test failed.");
                                                    __cxa_throw(plVar13,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ != local_70) {
LAB_001e3e72:
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar13,"test failed.");
                                                    pcVar15 = std::logic_error::~logic_error;
                                                    puVar18 = &std::logic_error::typeinfo;
                                                    goto LAB_001e4614;
                                                  }
                                                  if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar13,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if ((MarrayTest *)local_a0._0_8_ !=
                                                        (MarrayTest *)0x0) {
                                                      if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != sStack_78)
                                                  goto LAB_001e3e72;
                                                  iVar17 = 0;
                                                  do {
                                                    local_f4 = iVar17;
                                                    piVar6 = andres::marray_detail::
                                                             AccessOperatorHelper<true>::
                                                                                                                          
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                  iVar1 = *piVar6;
                                                  local_f4 = iVar17;
                                                  piVar6 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                                  if (iVar1 != *piVar6) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar13,"test failed.");
                                                    __cxa_throw(plVar13,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  iVar17 = iVar17 + 1;
                                                  } while (iVar17 != 0x18);
                                                  operator_delete((void *)local_a0._0_8_,
                                                                  local_70 << 2);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  operator_delete(_Var7._M_current,8);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_f0,8);
                                                  local_a0._0_8_ = (pointer)0x0;
                                                  local_90 = (size_t *)0x0;
                                                  psStack_88 = (size_t *)0x0;
                                                  local_80 = (size_t *)0x0;
                                                  sStack_78 = 0;
                                                  local_70 = 0;
                                                  local_68 = LastMajorOrder;
                                                  local_64 = true;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_a0);
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  pMVar4 = local_48;
                                                  *_Var7._M_current = 0x18;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 1),&local_48->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_a0);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var7._M_current,8);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  local_f0 = (unsigned_long *)operator_new(8);
                                                  *local_f0 = 0x18;
                                                  local_a0._0_8_ = local_50;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_a0 + 8),
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_f0,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_f0 + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_e8)
                                                  ;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_a0);
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var7._M_current = 0x18;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 1),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  local_f4 = 0;
                                                  piVar6 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_a0);
                                                  local_f4 = 0;
                                                  piVar11 = andres::marray_detail::
                                                            AccessOperatorHelper<true>::
                                                                                                                        
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                  if (piVar11 != piVar6) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar13,"test failed.");
                                                    __cxa_throw(plVar13,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_70 !=
                                                      local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_) {
LAB_001e3ea1:
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar13,"test failed.");
                                                    pcVar15 = std::logic_error::~logic_error;
                                                    puVar18 = &std::logic_error::typeinfo;
                                                    goto LAB_001e4696;
                                                  }
                                                  if ((int *)local_a0._0_8_ == (int *)0x0) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar13,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ != (pointer)0x0) {
                                                    if (sStack_78 !=
                                                        local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) goto LAB_001e3ea1;
                                                  iVar17 = 0;
                                                  do {
                                                    local_f4 = iVar17;
                                                    piVar10 = andres::marray_detail::
                                                              AccessOperatorHelper<true>::
                                                                                                                            
                                                  execute<int,int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_a0,&local_f4);
                                                  iVar1 = *piVar10;
                                                  local_f4 = iVar17;
                                                  piVar6 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                  if (iVar1 != *piVar6) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar13,"test failed.");
                                                    __cxa_throw(plVar13,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  iVar17 = iVar17 + 1;
                                                  } while (iVar17 != 0x18);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var7._M_current,8);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  operator_delete(local_f0,8);
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ = (pointer)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_ = (size_t *)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shapeStrides_ = (size_t *)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.strides_ = (size_t *)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ = 0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ = 0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.coordinateOrder_ = LastMajorOrder;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.isSimple_ = true;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  pMVar4 = local_48;
                                                  if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.isSimple_ == false) {
                                                    prVar14 = (runtime_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              (prVar14,"Assertion failed.");
                                                    __cxa_throw(prVar14,&std::runtime_error::
                                                                         typeinfo,
                                                                std::runtime_error::~runtime_error);
                                                  }
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var7._M_current = 4;
                                                  _Var7._M_current[1] = 6;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  local_a0,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 2),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  operator=((
                                                  Marray<int,_std::allocator<unsigned_long>_> *)
                                                  local_a0,&local_e8);
                                                  operator_delete((void *)local_a0._0_8_,
                                                                  local_70 << 2);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  operator_delete(_Var7._M_current,0x10);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  local_54 = 2;
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var7._M_current = 6;
                                                  _Var7._M_current[1] = 4;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 2),&local_54,
                                                  &andres::defaultOrder,(allocator_type *)local_a0);
                                                  _Var12._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var12._M_current = 6;
                                                  _Var12._M_current[1] = 4;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  local_a0,_Var12,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var12._M_current + 2),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  local_f4 = 0;
                                                  piVar6 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  operator=((
                                                  Marray<int,_std::allocator<unsigned_long>_> *)
                                                  local_a0,&local_e8);
                                                  local_f4 = 0;
                                                  piVar11 = andres::marray_detail::
                                                            AccessOperatorHelper<true>::
                                                                                                                        
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                                  if (piVar11 != piVar6) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar13,"test failed.");
                                                    __cxa_throw(plVar13,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ != local_70) {
LAB_001e3ed0:
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar13,"test failed.");
                                                    pcVar15 = std::logic_error::~logic_error;
                                                    puVar18 = &std::logic_error::typeinfo;
                                                    goto LAB_001e474a;
                                                  }
                                                  if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar13,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if ((int *)local_a0._0_8_ != (int *)0x0) {
                                                      if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != sStack_78)
                                                  goto LAB_001e3ed0;
                                                  sVar16 = 0;
                                                  local_f0 = _Var7._M_current;
                                                  do {
                                                    iVar17 = 0;
                                                    do {
                                                      piVar6 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_e8,sVar16,iVar17);
                                                  iVar1 = *piVar6;
                                                  piVar6 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_a0,sVar16,iVar17);
                                                  if (iVar1 != *piVar6) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar13,"test failed.");
                                                    __cxa_throw(plVar13,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  iVar17 = iVar17 + 1;
                                                  } while (iVar17 != 4);
                                                  sVar16 = sVar16 + 1;
                                                  } while (sVar16 != 6);
                                                  operator_delete((void *)local_a0._0_8_,
                                                                  local_70 << 2);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  operator_delete(_Var12._M_current,0x10);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_f0,0x10);
                                                  local_a0._0_8_ = (pointer)0x0;
                                                  local_90 = (size_t *)0x0;
                                                  psStack_88 = (size_t *)0x0;
                                                  local_80 = (size_t *)0x0;
                                                  sStack_78 = 0;
                                                  local_70 = 0;
                                                  local_68 = LastMajorOrder;
                                                  local_64 = true;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_a0);
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  pMVar4 = local_48;
                                                  *_Var7._M_current = 4;
                                                  _Var7._M_current[1] = 6;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 2),&local_48->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_a0);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var7._M_current,0x10);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var7._M_current = 6;
                                                  _Var7._M_current[1] = 4;
                                                  local_a0._0_8_ = local_50;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_a0 + 8),_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_e8)
                                                  ;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_a0);
                                                  _Var12._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var12._M_current = 6;
                                                  _Var12._M_current[1] = 4;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,_Var12,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var12._M_current + 2),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  local_f4 = 0;
                                                  piVar6 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_a0);
                                                  local_f4 = 0;
                                                  piVar11 = andres::marray_detail::
                                                            AccessOperatorHelper<true>::
                                                                                                                        
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                  if (piVar11 != piVar6) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar13,"test failed.");
                                                    __cxa_throw(plVar13,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_70 !=
                                                      local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_) {
LAB_001e3eff:
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar13,"test failed.");
                                                    pcVar15 = std::logic_error::~logic_error;
                                                    puVar18 = &std::logic_error::typeinfo;
                                                    goto LAB_001e47cc;
                                                  }
                                                  if ((int *)local_a0._0_8_ == (int *)0x0) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar13,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ != (pointer)0x0) {
                                                    if (sStack_78 !=
                                                        local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) goto LAB_001e3eff;
                                                  sVar16 = 0;
                                                  local_f0 = _Var7._M_current;
                                                  do {
                                                    iVar17 = 0;
                                                    do {
                                                      piVar10 = andres::
                                                  View<int,true,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,true,std::allocator<unsigned_long>> *)
                                                  local_a0,sVar16,iVar17);
                                                  iVar1 = *piVar10;
                                                  piVar6 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_e8,sVar16,iVar17);
                                                  if (iVar1 != *piVar6) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar13,"test failed.");
                                                    __cxa_throw(plVar13,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  iVar17 = iVar17 + 1;
                                                  } while (iVar17 != 4);
                                                  sVar16 = sVar16 + 1;
                                                  } while (sVar16 != 6);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var12._M_current,0x10);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  operator_delete(local_f0,0x10);
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ = (pointer)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_ = (size_t *)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shapeStrides_ = (size_t *)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.strides_ = (size_t *)0x0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ = 0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ = 0;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.coordinateOrder_ = LastMajorOrder;
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.isSimple_ = true;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  pMVar4 = local_48;
                                                  if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.isSimple_ == false) {
                                                    prVar14 = (runtime_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              (prVar14,"Assertion failed.");
                                                    __cxa_throw(prVar14,&std::runtime_error::
                                                                         typeinfo,
                                                                std::runtime_error::~runtime_error);
                                                  }
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var7._M_current = 2;
                                                  _Var7._M_current[1] = 3;
                                                  _Var7._M_current[2] = 4;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  local_a0,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 3),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  operator=((
                                                  Marray<int,_std::allocator<unsigned_long>_> *)
                                                  local_a0,&local_e8);
                                                  operator_delete((void *)local_a0._0_8_,
                                                                  local_70 << 2);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  operator_delete(_Var7._M_current,0x18);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  local_54 = 2;
                                                  local_40 = (unsigned_long *)operator_new(0x18);
                                                  *local_40 = 3;
                                                  local_40[1] = 4;
                                                  local_40[2] = 2;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_40,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_40 + 3),&local_54,&andres::defaultOrder,
                                                  (allocator_type *)local_a0);
                                                  local_38 = (unsigned_long *)operator_new(0x18);
                                                  *local_38 = 3;
                                                  local_38[1] = 4;
                                                  local_38[2] = 2;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  local_a0,(
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_38,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_38 + 3),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  local_f4 = 0;
                                                  piVar6 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                                  andres::
                                                  Marray<int,_std::allocator<unsigned_long>_>::
                                                  operator=((
                                                  Marray<int,_std::allocator<unsigned_long>_> *)
                                                  local_a0,&local_e8);
                                                  local_f4 = 0;
                                                  piVar11 = andres::marray_detail::
                                                            AccessOperatorHelper<true>::
                                                                                                                        
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,&local_f4);
                                                  if (piVar11 != piVar6) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar13,"test failed.");
                                                    __cxa_throw(plVar13,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ != local_70) {
LAB_001e3f2e:
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar13,"test failed.");
                                                    pcVar15 = std::logic_error::~logic_error;
                                                    puVar18 = &std::logic_error::typeinfo;
                                                    goto LAB_001e4880;
                                                  }
                                                  if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar13,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if ((int *)local_a0._0_8_ != (int *)0x0) {
                                                      if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != sStack_78)
                                                  goto LAB_001e3f2e;
                                                  local_f0 = (unsigned_long *)0x0;
                                                  do {
                                                    sVar16 = 0;
                                                    do {
                                                      iVar17 = 0;
                                                      bVar5 = true;
                                                      do {
                                                        bVar19 = bVar5;
                                                        andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  piVar2 = local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_;
                                                  if ((local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) ||
                                                  (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar13,
                                                               "Assertion failed.");
LAB_001e3a70:
                                                    pcVar15 = std::runtime_error::~runtime_error;
                                                    puVar18 = &std::runtime_error::typeinfo;
LAB_001e3a7e:
                                                    __cxa_throw(plVar13,puVar18,pcVar15);
                                                  }
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,sVar16,iVar17);
                                                  iVar1 = piVar2[sVar8 * (long)local_f0 + sVar9];
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0);
                                                  uVar3 = local_a0._0_8_;
                                                  if (((int *)local_a0._0_8_ == (int *)0x0) ||
                                                     (sStack_78 != 3)) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar13,
                                                               "Assertion failed.");
                                                    goto LAB_001e3a70;
                                                  }
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,0);
                                                  sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_a0,3,sVar16,iVar17);
                                                  if (iVar1 != *(int *)(uVar3 + (sVar8 * (long)
                                                  local_f0 + sVar9) * 4)) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar13,"test failed.");
                                                    pcVar15 = std::logic_error::~logic_error;
                                                    puVar18 = &std::logic_error::typeinfo;
                                                    goto LAB_001e3a7e;
                                                  }
                                                  iVar17 = 1;
                                                  bVar5 = false;
                                                  } while (bVar19);
                                                  sVar16 = sVar16 + 1;
                                                  } while (sVar16 != 4);
                                                  local_f0 = (unsigned_long *)((long)local_f0 + 1);
                                                  } while (local_f0 != (unsigned_long *)0x3);
                                                  operator_delete((void *)local_a0._0_8_,
                                                                  local_70 << 2);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  operator_delete(local_38,0x18);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_40,0x18);
                                                  local_a0._0_8_ = (pointer)0x0;
                                                  local_90 = (size_t *)0x0;
                                                  psStack_88 = (size_t *)0x0;
                                                  local_80 = (size_t *)0x0;
                                                  sStack_78 = 0;
                                                  local_70 = 0;
                                                  local_68 = LastMajorOrder;
                                                  local_64 = true;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_a0);
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  pMVar4 = local_48;
                                                  *_Var7._M_current = 2;
                                                  _Var7._M_current[1] = 3;
                                                  _Var7._M_current[2] = 4;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 3),&local_48->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_a0);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var7._M_current,0x18);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var7._M_current = 3;
                                                  _Var7._M_current[1] = 4;
                                                  _Var7._M_current[2] = 2;
                                                  local_a0._0_8_ = local_50;
                                                  local_50 = (int *)_Var7._M_current;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_a0 + 8),_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_e8)
                                                  ;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_a0);
                                                  local_40 = (unsigned_long *)operator_new(0x18);
                                                  *local_40 = 3;
                                                  local_40[1] = 4;
                                                  local_40[2] = 2;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_40,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_40 + 3),&pMVar4->scalar_,
                                                  &andres::defaultOrder,(allocator_type *)&local_f4)
                                                  ;
                                                  local_f4 = 0;
                                                  piVar6 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::operator=((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_e8,
                                                  (View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_a0);
                                                  local_f4 = 0;
                                                  piVar11 = andres::marray_detail::
                                                            AccessOperatorHelper<true>::
                                                                                                                        
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,&local_f4);
                                                  if (piVar11 != piVar6) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar13,"test failed.");
                                                    __cxa_throw(plVar13,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_70 ==
                                                      local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_) {
                                                    if ((int *)local_a0._0_8_ == (int *)0x0) {
                                                      plVar13 = (logic_error *)
                                                                __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar13,
                                                                 "Assertion failed.");
                                                    }
                                                    else {
                                                      if (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ != (pointer)0x0) {
                                                    if (sStack_78 ==
                                                        local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_) {
                                                    local_f0 = (unsigned_long *)0x0;
                                                    do {
                                                      sVar16 = 0;
                                                      do {
                                                        iVar17 = 0;
                                                        bVar5 = true;
                                                        do {
                                                          bVar19 = bVar5;
                                                          andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_a0);
                                                  uVar3 = local_a0._0_8_;
                                                  if (((int *)local_a0._0_8_ == (int *)0x0) ||
                                                     (sStack_78 != 3)) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar13,
                                                               "Assertion failed.");
LAB_001e3aec:
                                                    pcVar15 = std::runtime_error::~runtime_error;
                                                    puVar18 = &std::runtime_error::typeinfo;
LAB_001e3afa:
                                                    __cxa_throw(plVar13,puVar18,pcVar15);
                                                  }
                                                  sVar8 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_a0,0);
                                                  sVar9 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_a0,3,sVar16,iVar17);
                                                  iVar1 = *(int *)(uVar3 + (sVar8 * (long)local_f0 +
                                                                           sVar9) * 4);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  piVar2 = local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_;
                                                  if ((local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) ||
                                                  (local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar13,
                                                               "Assertion failed.");
                                                    goto LAB_001e3aec;
                                                  }
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,sVar16,iVar17);
                                                  if (iVar1 != piVar2[sVar8 * (long)local_f0 + sVar9
                                                                     ]) {
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar13,"test failed.");
                                                    pcVar15 = std::logic_error::~logic_error;
                                                    puVar18 = &std::logic_error::typeinfo;
                                                    goto LAB_001e3afa;
                                                  }
                                                  iVar17 = 1;
                                                  bVar5 = false;
                                                  } while (bVar19);
                                                  sVar16 = sVar16 + 1;
                                                  } while (sVar16 != 4);
                                                  local_f0 = (unsigned_long *)((long)local_f0 + 1);
                                                  if (local_f0 == (unsigned_long *)0x3) {
                                                    operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_e8.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_40,0x18);
                                                  operator_delete(local_90,sStack_78 * 0x18);
                                                  operator_delete(local_50,0x18);
                                                  return;
                                                  }
                                                  } while( true );
                                                  }
                                                  goto LAB_001e41c9;
                                                  }
                                                  plVar13 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar13,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar15 = std::runtime_error::~runtime_error;
                                                  puVar18 = &std::runtime_error::typeinfo;
                                                  }
                                                  else {
LAB_001e41c9:
                                                    plVar13 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar13,"test failed.");
                                                    pcVar15 = std::logic_error::~logic_error;
                                                    puVar18 = &std::logic_error::typeinfo;
                                                  }
                                                  __cxa_throw(plVar13,puVar18,pcVar15);
                                                  }
                                                  plVar13 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar13,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar15 = std::runtime_error::~runtime_error;
                                                  puVar18 = &std::runtime_error::typeinfo;
LAB_001e4880:
                                                  __cxa_throw(plVar13,puVar18,pcVar15);
                                                  }
                                                  plVar13 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar13,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar15 = std::runtime_error::~runtime_error;
                                                  puVar18 = &std::runtime_error::typeinfo;
LAB_001e47cc:
                                                  __cxa_throw(plVar13,puVar18,pcVar15);
                                                  }
                                                  plVar13 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar13,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar15 = std::runtime_error::~runtime_error;
                                                  puVar18 = &std::runtime_error::typeinfo;
LAB_001e474a:
                                                  __cxa_throw(plVar13,puVar18,pcVar15);
                                                  }
                                                  plVar13 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar13,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar15 = std::runtime_error::~runtime_error;
                                                  puVar18 = &std::runtime_error::typeinfo;
LAB_001e4696:
                                                  __cxa_throw(plVar13,puVar18,pcVar15);
                                                  }
                                                  plVar13 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar13,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar15 = std::runtime_error::~runtime_error;
                                                  puVar18 = &std::runtime_error::typeinfo;
LAB_001e4614:
                                                  __cxa_throw(plVar13,puVar18,pcVar15);
                                                  }
                                                  }
LAB_001e3db6:
                                                  plVar13 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar13,"test failed.");
                                                  pcVar15 = std::logic_error::~logic_error;
                                                  puVar18 = &std::logic_error::typeinfo;
                                                  goto LAB_001e4560;
                                                  }
                                                  plVar13 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar13,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar15 = std::runtime_error::~runtime_error;
                                                  puVar18 = &std::runtime_error::typeinfo;
LAB_001e4560:
                                                  __cxa_throw(plVar13,puVar18,pcVar15);
                                                }
                                              }
                                              plVar13 = (logic_error *)
                                                        __cxa_allocate_exception(0x10);
                                              std::logic_error::logic_error(plVar13,"test failed.");
                                              pcVar15 = std::logic_error::~logic_error;
                                              puVar18 = &std::logic_error::typeinfo;
                                              goto LAB_001e44de;
                                            }
                                            plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      ((runtime_error *)plVar13,"Assertion failed.")
                                            ;
                                          }
                                          pcVar15 = std::runtime_error::~runtime_error;
                                          puVar18 = &std::runtime_error::typeinfo;
LAB_001e44de:
                                          __cxa_throw(plVar13,puVar18,pcVar15);
                                        }
                                        plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar13,"Assertion failed.");
                                      }
                                      pcVar15 = std::runtime_error::~runtime_error;
                                      puVar18 = &std::runtime_error::typeinfo;
LAB_001e442a:
                                      __cxa_throw(plVar13,puVar18,pcVar15);
                                    }
                                    plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar13,"Assertion failed.");
                                  }
                                  pcVar15 = std::runtime_error::~runtime_error;
                                  puVar18 = &std::runtime_error::typeinfo;
LAB_001e43a8:
                                  __cxa_throw(plVar13,puVar18,pcVar15);
                                }
                                plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar13,"Assertion failed.");
                              }
                              pcVar15 = std::runtime_error::~runtime_error;
                              puVar18 = &std::runtime_error::typeinfo;
LAB_001e4326:
                              __cxa_throw(plVar13,puVar18,pcVar15);
                            }
                          }
LAB_001e3ccb:
                          plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::logic_error::logic_error(plVar13,"test failed.");
                          pcVar15 = std::logic_error::~logic_error;
                          puVar18 = &std::logic_error::typeinfo;
                          goto LAB_001e42a4;
                        }
                        plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  ((runtime_error *)plVar13,"Assertion failed.");
                      }
                      pcVar15 = std::runtime_error::~runtime_error;
                      puVar18 = &std::runtime_error::typeinfo;
LAB_001e42a4:
                      __cxa_throw(plVar13,puVar18,pcVar15);
                    }
                    plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error((runtime_error *)plVar13,"Assertion failed.");
                  }
                  pcVar15 = std::runtime_error::~runtime_error;
                  puVar18 = &std::runtime_error::typeinfo;
LAB_001e41c1:
                  __cxa_throw(plVar13,puVar18,pcVar15);
                }
                plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar13,"Assertion failed.");
              }
              pcVar15 = std::runtime_error::~runtime_error;
              puVar18 = &std::runtime_error::typeinfo;
LAB_001e413f:
              __cxa_throw(plVar13,puVar18,pcVar15);
            }
            plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar13,"Assertion failed.");
          }
          pcVar15 = std::runtime_error::~runtime_error;
          puVar18 = &std::runtime_error::typeinfo;
LAB_001e40bd:
          __cxa_throw(plVar13,puVar18,pcVar15);
        }
      }
      plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar13,"test failed.");
      pcVar15 = std::logic_error::~logic_error;
      puVar18 = &std::logic_error::typeinfo;
      goto LAB_001e403b;
    }
    plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar13,"Assertion failed.");
  }
  pcVar15 = std::runtime_error::~runtime_error;
  puVar18 = &std::runtime_error::typeinfo;
LAB_001e403b:
  __cxa_throw(plVar13,puVar18,pcVar15);
}

Assistant:

void MarrayTest::assignmentOperatorTest(){
    // empty
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                andres::Marray<int> n;
                n = m;
            }
            // scalar
            {
                andres::Marray<int> m(scalar_);
                andres::Marray<int> n;
                n = m;

                test(m.dimension() == n.dimension() &&
                       m.size() == n.size() &&
                       m(0) == n(0));
            }
            // 1D
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
                andres::Marray<int> n;
                n = m;

                test(m.size()==n.size() && m.dimension()==n.dimension()
                );
                for(int x = 0; x < 24; ++x)
                    test(m(x)==n(x));
            }
            // 2D
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::Marray<int> m(shape.begin(), shape.end(), scalar_);

                andres::Marray<int> n;
                n = m;

                test(m.size()==n.size() && m.dimension()==n.dimension()
                );
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(m(x, y)==n(x, y));
                }
            }
            // 3D 
            {
                std::vector<std::size_t> shape(3); 
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
                andres::Marray<int> n;
                n = m;

                test(m.size()==n.size() && m.dimension()==n.dimension()
                );
                for(int x = 0; x < 3; ++x){
                    for(int y = 0; y < 4; ++y){
                        for(int z = 0; z < 2; ++z)
                            test(m(x, y, z)==n(x, y, z));
                    }
                }
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                andres::Marray<int> m;
                m = v;
            }
            // scalar
            {
                andres::View<int, constTarget> v(&scalar_);
                andres::Marray<int> m;
                m = v;

                test(v.size()==m.size() &&
                       v.dimension()==m.dimension() &&
                       v(0)==m(0));
            }
            // 1D
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m;
                m = v;
                
                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int i = 0; i < 24; ++i)
                    test(v(i)==m(i));
            }
            // 2D
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m;
                m = v;

                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(v(x, y)==m(x, y));
                }
            }
            // 3D
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m;
                m = v;

                test(v.size()==m.size() &&
                       v.dimension()==m.dimension());
                for(int x = 0; x < 3; ++x){
                    for(int y = 0; y < 4; ++y){
                        for(int z = 0; z < 2; ++z)
                            test(v(x, y, z)==m(x, y, z));
                    }
                }
            }
        }
    }
    // scalar
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                andres::Marray<int> n(scalar_);
                n = m;
            }
            // scalar
            {
                int scalar = 2;
                andres::Marray<int> m(scalar);
                andres::Marray<int> n(scalar_);
                int* n_address = &n(0);
                n = m;
                
                test(&n(0) == n_address);
                test(m.dimension() == n.dimension() &&
                       m.size() == n.size() &&
                       m(0) == n(0));
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                andres::Marray<int> m(scalar_);
                m = v;
            }
            // scalar
            {
                andres::View<int, constTarget> v(&scalar_);
                andres::Marray<int> m(scalar_);
                int* m_address = &m(0);
                m = v;
                
                test(&m(0) == m_address);
                test(v.size()==m.size() &&
                       v.dimension()==m.dimension() &&
                       v(0)==m(0));
            }
        }
    }
    // 1D
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                std::vector<std::size_t> shapen(1);
                shapen[0] = 24;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                n = m;
            }
            // 1D
            {
                int scalar = 2;
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::Marray<int> m(shape.begin(), shape.end(), scalar);
                std::vector<std::size_t> shapen(1);
                shapen[0] = 24;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                int* n_address = &n(0);
                n = m;
                
                test(&n(0) == n_address
                );
                test(m.size()==n.size() && m.dimension()==n.dimension()
                );
                for(int x = 0; x < 24; ++x)
                    test(m(x)==n(x));
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                std::vector<std::size_t> shapem(1);
                shapem[0] = 24;
                andres::Marray<int> m(shapem.begin(), shapem.end(), scalar_);
                m = v;
            }
            // 1D
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                std::vector<std::size_t> shapem(1);
                shapem[0] = 24;
                andres::Marray<int> m(shapem.begin(), shapem.end(), scalar_);
                int* m_address = &m(0);
                m = v;
                
                test(&m(0) == m_address
                );
                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int i = 0; i < 24; ++i)
                    test(v(i)==m(i));
            }
        }
    }
    // 2D
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                std::vector<std::size_t> shapen(2);
                shapen[0] = 4;
                shapen[1] = 6;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                n = m;
            }
            // 2D
            {
                int scalar = 2;
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::Marray<int> m(shape.begin(), shape.end(), scalar);
                std::vector<std::size_t> shapen(2);
                shapen[0] = 6;
                shapen[1] = 4;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                int* n_address = &n(0);
                n = m;
                
                test(&n(0) == n_address);
                test(m.size()==n.size() && m.dimension()==n.dimension());
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(m(x, y)==n(x, y));
                }
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                std::vector<std::size_t> shapen(2);
                shapen[0] = 4;
                shapen[1] = 6;
                andres::Marray<int> m(shapen.begin(), shapen.end(), scalar_);
                m = v;
            }
            // 2D
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                std::vector<std::size_t> shapen(2);
                shapen[0] = 6;
                shapen[1] = 4;
                andres::Marray<int> m(shapen.begin(), shapen.end(), scalar_);
                int* m_address = &m(0);
                m = v;
                
                test(&m(0) == m_address);
                test(v.size()==m.size() && v.dimension()==m.dimension());
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(v(x, y)==m(x, y));
                }
            }
        }
    }
    // 3D
    {
        // from a Marray
        {
            // empty
            {
                andres::Marray<int> m;
                std::vector<std::size_t> shapen(3);
                shapen[0] = 2;
                shapen[1] = 3;
                shapen[2] = 4;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                n = m;
            }
            // 3D 
            {
                int scalar = 2;
                std::vector<std::size_t> shape(3); 
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::Marray<int> m(shape.begin(), shape.end(), scalar);
                std::vector<std::size_t> shapen(3);
                shapen[0] = 3;
                shapen[1] = 4;
                shapen[2] = 2;
                andres::Marray<int> n(shapen.begin(), shapen.end(), scalar_);
                int* n_address = &n(0);
                n = m;
                
                test(&n(0) == n_address);
                test(m.size()==n.size() && m.dimension()==n.dimension());
                for(int x = 0; x < 3; ++x){
                    for(int y = 0; y < 4; ++y){
                        for(int z = 0; z < 2; ++z)
                            test(m(x, y, z)==n(x, y, z));
                    }
                }
            }
        }
        // from a view
        {
            // empty
            {
                andres::View<int, constTarget> v;
                std::vector<std::size_t> shapen(3);
                shapen[0] = 2;
                shapen[1] = 3;
                shapen[2] = 4;
                andres::Marray<int> m(shapen.begin(), shapen.end(), scalar_);
                m = v;
            }
            // 3D
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                std::vector<std::size_t> shapen(3);
                shapen[0] = 3;
                shapen[1] = 4;
                shapen[2] = 2;
                andres::Marray<int> m(shapen.begin(), shapen.end(), scalar_);
                int* m_address = &m(0);
                m = v;
                
                test(&m(0) == m_address
                );
                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int x = 0; x < 3; ++x){
                    for(int y = 0; y < 4; ++y){
                        for(int z = 0; z < 2; ++z)
                            test(v(x, y, z)==m(x, y, z));
                    }
                }
            }
        }
    }
}